

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int bio_fread_intv_3d(void ****arr,size_t e_sz,uint32 s,uint32 e,uint32 *d1,uint32 *d2,uint32 *d3,
                     FILE *fp,uint32 swap,uint32 *chksum)

{
  int32 iVar1;
  uint uVar2;
  int iVar3;
  uint n_el;
  uint uVar4;
  void *pvVar5;
  size_t ret;
  void *raw;
  uint32 n;
  uint32 s_d1;
  uint32 l_d3;
  uint32 l_d2;
  uint32 l_d1;
  uint32 *d2_local;
  uint32 *d1_local;
  uint32 e_local;
  uint32 s_local;
  size_t e_sz_local;
  void ****arr_local;
  
  _l_d2 = d2;
  d2_local = d1;
  d1_local._0_4_ = e;
  d1_local._4_4_ = s;
  _e_local = e_sz;
  e_sz_local = (size_t)arr;
  iVar1 = bio_fread(&l_d3,4,1,fp,swap,chksum);
  if (iVar1 == 1) {
    if ((l_d3 <= d1_local._4_4_) || (l_d3 <= (uint32)d1_local)) {
      if (l_d3 <= d1_local._4_4_) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x15d,"Start, %u, is outside the interval [0 %u]\n",(ulong)d1_local._4_4_,
                (ulong)(l_d3 - 1));
      }
      if (l_d3 <= (uint32)d1_local) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,0x161,"End, %u, is outside the interval [0 %u]\n",(ulong)(uint32)d1_local,
                (ulong)(l_d3 - 1));
      }
      exit(-1);
    }
    iVar1 = bio_fread(&s_d1,4,1,fp,swap,chksum);
    if (iVar1 == 1) {
      iVar1 = bio_fread(&n,4,1,fp,swap,chksum);
      if (iVar1 == 1) {
        uVar2 = ((uint32)d1_local - d1_local._4_4_) + 1;
        iVar3 = fseek((FILE *)fp,(d1_local._4_4_ * s_d1 * n) * _e_local + 4,1);
        if (iVar3 < 0) {
          err_msg_system(ERR_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                         ,0x180,"Can\'t seek in file");
          exit(1);
        }
        n_el = uVar2 * s_d1 * n;
        pvVar5 = __ckd_calloc__((ulong)n_el,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                                ,0x184);
        uVar4 = bio_fread(pvVar5,(int32)_e_local,n_el,fp,swap,chksum);
        if (uVar4 != n_el) {
          err_msg_system(ERR_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                         ,0x186,"Can\'t read");
          exit(1);
        }
        pvVar5 = __ckd_alloc_3d_ptr((ulong)uVar2,(ulong)s_d1,(ulong)n,pvVar5,_e_local,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                                    ,0x189);
        *(void **)e_sz_local = pvVar5;
        *d2_local = uVar2;
        *_l_d2 = s_d1;
        *d3 = n;
        arr_local._4_4_ = 0;
      }
      else {
        if (iVar1 == 0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                         ,0x174,"Unable to read complete data");
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                         ,0x177,"OS error in bio_fread_3d");
        }
        arr_local._4_4_ = -1;
      }
    }
    else {
      if (iVar1 == 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                       ,0x16a,"Unable to read complete data");
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                       ,0x16d,"OS error in bio_fread_3d");
      }
      arr_local._4_4_ = -1;
    }
  }
  else {
    if (iVar1 == 0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                     ,0x152,"Unable to read complete data");
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                     ,0x155,"OS error in bio_fread_3d");
    }
    arr_local._4_4_ = -1;
  }
  return arr_local._4_4_;
}

Assistant:

int
bio_fread_intv_3d(void ****arr,
	       size_t e_sz,
	       uint32 s,
	       uint32 e,
	       uint32 *d1,
	       uint32 *d2,
	       uint32 *d3,
	       FILE *fp,
	       uint32 swap,
	       uint32 *chksum)
{
    uint32 l_d1;
    uint32 l_d2;
    uint32 l_d3;
    uint32 s_d1;
    uint32 n;
    void *raw;
    size_t ret;

    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return S3_ERROR;
    }

    if ((s >= l_d1) || (e >= l_d1)) {
	if (s >= l_d1) {
	    E_ERROR("Start, %u, is outside the interval [0 %u]\n",
		    s, l_d1-1);
	}
	if (e >= l_d1) {
	    E_ERROR("End, %u, is outside the interval [0 %u]\n",
		    e, l_d1-1);
	}
	
	exit(-1);
    }

    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return S3_ERROR;
    }
    ret = bio_fread(&l_d3, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return S3_ERROR;
    }

    /* # of rows in subinterval */
    s_d1 = e - s + 1;
    
    if (fseek(fp, (long)(s*l_d2*l_d3*e_sz + sizeof(uint32)), SEEK_CUR) < 0) {
	E_FATAL_SYSTEM("Can't seek in file");
    }

    n = s_d1 * l_d2 * l_d3;
    raw = ckd_calloc(n, sizeof(float32));
    if (bio_fread(raw, e_sz, n, fp, swap, chksum) != n) {
	E_FATAL_SYSTEM("Can't read");
    }

    *arr = ckd_alloc_3d_ptr(s_d1, l_d2, l_d3, raw, e_sz);

    *d1 = s_d1;
    *d2 = l_d2;
    *d3 = l_d3;
    
    return S3_SUCCESS;
}